

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateColsPS::execute
          (DuplicateColsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_2,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_3,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *u;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *u_00;
  uint *puVar2;
  int iVar3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  type_conflict5 tVar5;
  bool bVar6;
  VarStatus VVar7;
  double *pdVar8;
  SPxInternalCodeException *pSVar9;
  pointer pnVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  ulong uVar12;
  long lVar13;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  long lVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z1;
  cpp_dec_float<50U,_int,_void> local_11a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_25;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_10e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_23;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1068;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_21;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_fe8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_19;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ee8;
  cpp_dec_float<50U,_int,_void> local_ea8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_de8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ce8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_be8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ba8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b28;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  int local_ac0;
  undefined1 local_abc;
  undefined8 local_ab8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_aa8;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  int local_a40;
  undefined1 local_a3c;
  undefined8 local_a38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_968;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_928;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_868;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_828;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_768;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_730;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_688;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_650;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_618;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_570;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_500;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4c8;
  cpp_dec_float<50U,_int,_void> local_490;
  cpp_dec_float<50U,_int,_void> local_458;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_420;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  cpp_dec_float<50U,_int,_void> local_378;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_340;
  cpp_dec_float<50U,_int,_void> local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_260;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1f0;
  cpp_dec_float<50U,_int,_void> local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_180;
  cpp_dec_float<50U,_int,_void> local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  if (this->m_isFirst != false) {
    return;
  }
  if (this->m_isLast == true) {
    uVar12 = (ulong)(uint)(this->m_perm).thesize;
    lVar13 = uVar12 * 0x38;
    for (; 0 < (int)uVar12; uVar12 = uVar12 - 1) {
      lVar15 = (long)(this->m_perm).data[uVar12 - 1];
      if (-1 < lVar15) {
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)
                   ((long)pnVar10[-1].m_backend.data._M_elems + lVar13),&pnVar10[lVar15].m_backend);
        pnVar10 = (r->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)
                   ((long)pnVar10[-1].m_backend.data._M_elems + lVar13),&pnVar10[lVar15].m_backend);
        cStatus->data[uVar12 - 1] = cStatus->data[lVar15];
      }
      lVar13 = lVar13 + -0x38;
    }
    return;
  }
  iVar3 = this->m_k;
  switch(cStatus->data[iVar3]) {
  case ON_UPPER:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend,&(this->m_upK).m_backend)
    ;
    scale1.m_backend.data._M_elems._0_8_ = (ulong)scale1.m_backend.data._M_elems[1] << 0x20;
    tVar5 = boost::multiprecision::operator>(&this->m_scale,(int *)&scale1);
    pcVar14 = &(x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
    if (!tVar5) goto LAB_002b34b5;
LAB_002b3b08:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (pcVar14,&(this->m_upJ).m_backend);
    bVar6 = boost::multiprecision::operator==(&this->m_loJ,&this->m_upJ);
    VVar7 = (uint)bVar6 * 2;
    break;
  case ON_LOWER:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend,&(this->m_loK).m_backend)
    ;
    scale1.m_backend.data._M_elems._0_8_ = (ulong)scale1.m_backend.data._M_elems[1] << 0x20;
    tVar5 = boost::multiprecision::operator>(&this->m_scale,(int *)&scale1);
    pcVar14 = &(x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
    if (!tVar5) goto LAB_002b3b08;
LAB_002b34b5:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (pcVar14,&(this->m_loJ).m_backend);
    bVar6 = boost::multiprecision::operator==(&this->m_loJ,&this->m_upJ);
    VVar7 = bVar6 + ON_LOWER;
    break;
  case FIXED:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend,
               &(this->m_loJ).m_backend);
LAB_002b39a4:
    cStatus->data[this->m_j] = FIXED;
    goto switchD_002b3476_default;
  case ZERO:
    pnVar4 = &this->m_loK;
    local_768.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
    local_768.m_backend.data._M_elems[0] = (this->m_loK).m_backend.data._M_elems[0];
    local_768.m_backend.data._M_elems[1] = (this->m_loK).m_backend.data._M_elems[1];
    local_768.m_backend.data._M_elems[2] = (this->m_loK).m_backend.data._M_elems[2];
    local_768.m_backend.data._M_elems[3] = (this->m_loK).m_backend.data._M_elems[3];
    local_768.m_backend.data._M_elems[4] = (this->m_loK).m_backend.data._M_elems[4];
    local_768.m_backend.data._M_elems[5] = (this->m_loK).m_backend.data._M_elems[5];
    local_768.m_backend.data._M_elems[6] = (this->m_loK).m_backend.data._M_elems[6];
    local_768.m_backend.data._M_elems[7] = (this->m_loK).m_backend.data._M_elems[7];
    local_768.m_backend.exp = (this->m_loK).m_backend.exp;
    local_768.m_backend.neg = (this->m_loK).m_backend.neg;
    local_768.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
    local_768.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_68,this);
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_768,&local_68);
    if (bVar6) {
      local_7a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
      local_7a8.m_backend.data._M_elems[0] = (this->m_upK).m_backend.data._M_elems[0];
      local_7a8.m_backend.data._M_elems[1] = (this->m_upK).m_backend.data._M_elems[1];
      local_7a8.m_backend.data._M_elems[2] = (this->m_upK).m_backend.data._M_elems[2];
      local_7a8.m_backend.data._M_elems[3] = (this->m_upK).m_backend.data._M_elems[3];
      local_7a8.m_backend.data._M_elems[4] = (this->m_upK).m_backend.data._M_elems[4];
      local_7a8.m_backend.data._M_elems[5] = (this->m_upK).m_backend.data._M_elems[5];
      local_7a8.m_backend.data._M_elems[6] = (this->m_upK).m_backend.data._M_elems[6];
      local_7a8.m_backend.data._M_elems[7] = (this->m_upK).m_backend.data._M_elems[7];
      local_7a8.m_backend.exp = (this->m_upK).m_backend.exp;
      local_7a8.m_backend.neg = (this->m_upK).m_backend.neg;
      local_7a8.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
      local_7a8.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_a0,this);
      bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_7a8,&local_a0);
      if ((!bVar6) || (bVar6 = boost::multiprecision::operator==(pnVar4,&this->m_upK), !bVar6))
      goto LAB_002b3d3e;
      VVar7 = FIXED;
    }
    else {
LAB_002b3d3e:
      local_7e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
      local_7e8.m_backend.data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
      local_7e8.m_backend.data._M_elems[1] = (this->m_loK).m_backend.data._M_elems[1];
      local_7e8.m_backend.data._M_elems[2] = (this->m_loK).m_backend.data._M_elems[2];
      local_7e8.m_backend.data._M_elems[3] = (this->m_loK).m_backend.data._M_elems[3];
      local_7e8.m_backend.data._M_elems[4] = (this->m_loK).m_backend.data._M_elems[4];
      local_7e8.m_backend.data._M_elems[5] = (this->m_loK).m_backend.data._M_elems[5];
      local_7e8.m_backend.data._M_elems[6] = (this->m_loK).m_backend.data._M_elems[6];
      local_7e8.m_backend.data._M_elems[7] = (this->m_loK).m_backend.data._M_elems[7];
      local_7e8.m_backend.exp = (this->m_loK).m_backend.exp;
      local_7e8.m_backend.neg = (this->m_loK).m_backend.neg;
      local_7e8.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
      local_7e8.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_d8,this);
      bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_7e8,&local_d8);
      if (bVar6) {
        VVar7 = ON_LOWER;
      }
      else {
        local_828.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
        local_828.m_backend.data._M_elems[0] = (this->m_upK).m_backend.data._M_elems[0];
        local_828.m_backend.data._M_elems[1] = (this->m_upK).m_backend.data._M_elems[1];
        local_828.m_backend.data._M_elems[2] = (this->m_upK).m_backend.data._M_elems[2];
        local_828.m_backend.data._M_elems[3] = (this->m_upK).m_backend.data._M_elems[3];
        local_828.m_backend.data._M_elems[4] = (this->m_upK).m_backend.data._M_elems[4];
        local_828.m_backend.data._M_elems[5] = (this->m_upK).m_backend.data._M_elems[5];
        local_828.m_backend.data._M_elems[6] = (this->m_upK).m_backend.data._M_elems[6];
        local_828.m_backend.data._M_elems[7] = (this->m_upK).m_backend.data._M_elems[7];
        local_828.m_backend.exp = (this->m_upK).m_backend.exp;
        local_828.m_backend.neg = (this->m_upK).m_backend.neg;
        local_828.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
        local_828.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_110,this);
        bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_828,&local_110);
        VVar7 = ON_UPPER;
        if (!bVar6) {
          local_868.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
          local_868.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar4->m_backend).data._M_elems
          ;
          local_868.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 2);
          local_868.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 4);
          local_868.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 6);
          local_868.m_backend.exp = (this->m_loK).m_backend.exp;
          local_868.m_backend.neg = (this->m_loK).m_backend.neg;
          local_868.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
          local_868.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_148,0.0,(type *)0x0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_180,this);
          bVar6 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_868,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_148,&local_180);
          if (!bVar6) {
LAB_002b4ecc:
            pSVar9 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&scale1,"XMAISM05 This should never happen.",(allocator *)&scale2);
            SPxInternalCodeException::SPxInternalCodeException(pSVar9,(string *)&scale1);
            __cxa_throw(pSVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          local_8a8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
          local_8a8.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(this->m_upK).m_backend.data._M_elems;
          local_8a8.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 2);
          local_8a8.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 4);
          local_8a8.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 6);
          local_8a8.m_backend.exp = (this->m_upK).m_backend.exp;
          local_8a8.m_backend.neg = (this->m_upK).m_backend.neg;
          local_8a8.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
          local_8a8.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_1b8,0.0,(type *)0x0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_1f0,this);
          bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_8a8,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1b8,&local_1f0);
          if (!bVar6) goto LAB_002b4ecc;
          VVar7 = ZERO;
        }
      }
    }
    cStatus->data[this->m_k] = VVar7;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)
               ((x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
    pnVar4 = &this->m_loJ;
    local_8e8.m_backend.data._M_elems[0] = (this->m_loJ).m_backend.data._M_elems[0];
    local_8e8.m_backend.data._M_elems[1] = (this->m_loJ).m_backend.data._M_elems[1];
    local_8e8.m_backend.data._M_elems[2] = (this->m_loJ).m_backend.data._M_elems[2];
    local_8e8.m_backend.data._M_elems[3] = (this->m_loJ).m_backend.data._M_elems[3];
    local_8e8.m_backend.data._M_elems[4] = (this->m_loJ).m_backend.data._M_elems[4];
    local_8e8.m_backend.data._M_elems[5] = (this->m_loJ).m_backend.data._M_elems[5];
    local_8e8.m_backend.data._M_elems[6] = (this->m_loJ).m_backend.data._M_elems[6];
    local_8e8.m_backend.data._M_elems[7] = (this->m_loJ).m_backend.data._M_elems[7];
    local_8e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8);
    local_8e8.m_backend.exp = (this->m_loJ).m_backend.exp;
    local_8e8.m_backend.neg = (this->m_loJ).m_backend.neg;
    local_8e8.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    local_8e8.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_228,this);
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_8e8,&local_228);
    if (bVar6) {
      local_928.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 8);
      local_928.m_backend.data._M_elems[0] = (this->m_upJ).m_backend.data._M_elems[0];
      local_928.m_backend.data._M_elems[1] = (this->m_upJ).m_backend.data._M_elems[1];
      local_928.m_backend.data._M_elems[2] = (this->m_upJ).m_backend.data._M_elems[2];
      local_928.m_backend.data._M_elems[3] = (this->m_upJ).m_backend.data._M_elems[3];
      local_928.m_backend.data._M_elems[4] = (this->m_upJ).m_backend.data._M_elems[4];
      local_928.m_backend.data._M_elems[5] = (this->m_upJ).m_backend.data._M_elems[5];
      local_928.m_backend.data._M_elems[6] = (this->m_upJ).m_backend.data._M_elems[6];
      local_928.m_backend.data._M_elems[7] = (this->m_upJ).m_backend.data._M_elems[7];
      local_928.m_backend.exp = (this->m_upJ).m_backend.exp;
      local_928.m_backend.neg = (this->m_upJ).m_backend.neg;
      local_928.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
      local_928.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_260,this);
      bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_928,&local_260);
      if ((bVar6) && (bVar6 = boost::multiprecision::operator==(pnVar4,&this->m_upJ), bVar6))
      goto LAB_002b39a4;
    }
    local_968.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8);
    local_968.m_backend.data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
    local_968.m_backend.data._M_elems[1] = (this->m_loJ).m_backend.data._M_elems[1];
    local_968.m_backend.data._M_elems[2] = (this->m_loJ).m_backend.data._M_elems[2];
    local_968.m_backend.data._M_elems[3] = (this->m_loJ).m_backend.data._M_elems[3];
    local_968.m_backend.data._M_elems[4] = (this->m_loJ).m_backend.data._M_elems[4];
    local_968.m_backend.data._M_elems[5] = (this->m_loJ).m_backend.data._M_elems[5];
    local_968.m_backend.data._M_elems[6] = (this->m_loJ).m_backend.data._M_elems[6];
    local_968.m_backend.data._M_elems[7] = (this->m_loJ).m_backend.data._M_elems[7];
    local_968.m_backend.exp = (this->m_loJ).m_backend.exp;
    local_968.m_backend.neg = (this->m_loJ).m_backend.neg;
    local_968.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    local_968.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_298,this);
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_968,&local_298);
    if (bVar6) {
      cStatus->data[this->m_j] = ON_LOWER;
    }
    else {
      local_9a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 8);
      local_9a8.m_backend.data._M_elems[0] = (this->m_upJ).m_backend.data._M_elems[0];
      local_9a8.m_backend.data._M_elems[1] = (this->m_upJ).m_backend.data._M_elems[1];
      local_9a8.m_backend.data._M_elems[2] = (this->m_upJ).m_backend.data._M_elems[2];
      local_9a8.m_backend.data._M_elems[3] = (this->m_upJ).m_backend.data._M_elems[3];
      local_9a8.m_backend.data._M_elems[4] = (this->m_upJ).m_backend.data._M_elems[4];
      local_9a8.m_backend.data._M_elems[5] = (this->m_upJ).m_backend.data._M_elems[5];
      local_9a8.m_backend.data._M_elems[6] = (this->m_upJ).m_backend.data._M_elems[6];
      local_9a8.m_backend.data._M_elems[7] = (this->m_upJ).m_backend.data._M_elems[7];
      local_9a8.m_backend.exp = (this->m_upJ).m_backend.exp;
      local_9a8.m_backend.neg = (this->m_upJ).m_backend.neg;
      local_9a8.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
      local_9a8.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_2d0,this);
      bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_9a8,&local_2d0);
      if (!bVar6) {
        local_9e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8);
        local_9e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar4->m_backend).data._M_elems;
        local_9e8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 2);
        local_9e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 4);
        local_9e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 6);
        local_9e8.m_backend.exp = (this->m_loJ).m_backend.exp;
        local_9e8.m_backend.neg = (this->m_loJ).m_backend.neg;
        local_9e8.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
        local_9e8.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_308,0.0,(type *)0x0);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_340,this);
        bVar6 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_9e8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_308,&local_340);
        if (bVar6) {
          local_a28.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 8);
          local_a28.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(this->m_upJ).m_backend.data._M_elems;
          local_a28.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 2);
          local_a28.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 4);
          local_a28.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 6);
          local_a28.m_backend.exp = (this->m_upJ).m_backend.exp;
          local_a28.m_backend.neg = (this->m_upJ).m_backend.neg;
          local_a28.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
          local_a28.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_378,0.0,(type *)0x0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_3b0,this);
          bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_a28,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_378,&local_3b0);
          if (bVar6) {
            cStatus->data[this->m_j] = ZERO;
            goto switchD_002b3476_default;
          }
        }
        pSVar9 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&scale1,"XMAISM06 This should never happen.",(allocator *)&scale2);
        SPxInternalCodeException::SPxInternalCodeException(pSVar9,(string *)&scale1);
        __cxa_throw(pSVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      cStatus->data[this->m_j] = ON_UPPER;
    }
    goto switchD_002b3476_default;
  case BASIC:
    pnVar4 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_a48 = *(undefined8 *)(pnVar4[iVar3].m_backend.data._M_elems + 8);
    local_a68 = *(undefined8 *)pnVar4[iVar3].m_backend.data._M_elems;
    uStack_a60 = *(undefined8 *)(pnVar4[iVar3].m_backend.data._M_elems + 2);
    puVar2 = pnVar4[iVar3].m_backend.data._M_elems + 4;
    local_a58 = *(undefined8 *)puVar2;
    uStack_a50 = *(undefined8 *)(puVar2 + 2);
    local_a40 = pnVar4[iVar3].m_backend.exp;
    local_a3c = pnVar4[iVar3].m_backend.neg;
    local_a38._0_4_ = pnVar4[iVar3].m_backend.fpclass;
    local_a38._4_4_ = pnVar4[iVar3].m_backend.prec_elem;
    local_aa8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->m_loK).m_backend.data._M_elems;
    local_aa8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 2);
    local_aa8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 4);
    local_aa8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 6);
    local_aa8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
    local_aa8.m_backend.exp = (this->m_loK).m_backend.exp;
    local_aa8.m_backend.neg = (this->m_loK).m_backend.neg;
    local_aa8.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
    local_aa8.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
    maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&scale1,(soplex *)&local_a68,&local_aa8,pnVar4);
    iVar3 = this->m_k;
    pnVar4 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_ac8 = *(undefined8 *)(pnVar4[iVar3].m_backend.data._M_elems + 8);
    local_ae8 = *(undefined8 *)pnVar4[iVar3].m_backend.data._M_elems;
    uStack_ae0 = *(undefined8 *)(pnVar4[iVar3].m_backend.data._M_elems + 2);
    puVar2 = pnVar4[iVar3].m_backend.data._M_elems + 4;
    local_ad8 = *(undefined8 *)puVar2;
    uStack_ad0 = *(undefined8 *)(puVar2 + 2);
    local_ac0 = pnVar4[iVar3].m_backend.exp;
    local_abc = pnVar4[iVar3].m_backend.neg;
    local_ab8._0_4_ = pnVar4[iVar3].m_backend.fpclass;
    local_ab8._4_4_ = pnVar4[iVar3].m_backend.prec_elem;
    local_b28.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->m_upK).m_backend.data._M_elems;
    local_b28.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 2);
    local_b28.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 4);
    local_b28.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 6);
    local_b28.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
    local_b28.m_backend.exp = (this->m_upK).m_backend.exp;
    local_b28.m_backend.neg = (this->m_upK).m_backend.neg;
    local_b28.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
    local_b28.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
    maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&scale2,(soplex *)&local_ae8,&local_b28,pnVar4);
    z1.m_backend.data._M_elems[0] = 0;
    z1.m_backend.data._M_elems[1] = 0x3ff00000;
    tVar5 = boost::multiprecision::operator<(&scale1,(double *)&z1);
    if (tVar5) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&scale1,1.0);
    }
    pnVar4 = &this->m_loK;
    u = &this->m_upK;
    z1.m_backend.data._M_elems[0] = 0;
    z1.m_backend.data._M_elems[1] = 0x3ff00000;
    tVar5 = boost::multiprecision::operator<(&scale2,(double *)&z1);
    if (tVar5) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&scale2,1.0);
    }
    z2.m_backend.fpclass = cpp_dec_float_finite;
    z2.m_backend.prec_elem = 10;
    z2.m_backend.data._M_elems[0] = 0;
    z2.m_backend.data._M_elems[1] = 0;
    z2.m_backend.data._M_elems[2] = 0;
    z2.m_backend.data._M_elems[3] = 0;
    z2.m_backend.data._M_elems[4] = 0;
    z2.m_backend.data._M_elems[5] = 0;
    z2.m_backend.data._M_elems[6] = 0;
    z2.m_backend.data._M_elems[7] = 0;
    z2.m_backend.data._M_elems._32_5_ = 0;
    z2.m_backend.data._M_elems[9]._1_3_ = 0;
    z2.m_backend.exp = 0;
    z2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&z2.m_backend,
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&scale1.m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems._24_5_ = 0;
    result_1.m_backend.data._M_elems[7]._1_3_ = 0;
    result_1.m_backend.data._M_elems._32_5_ = 0;
    result_1.m_backend.data._M_elems[9]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_1.m_backend,&pnVar4->m_backend,&scale1.m_backend);
    z1.m_backend.fpclass = cpp_dec_float_finite;
    z1.m_backend.prec_elem = 10;
    z1.m_backend.data._M_elems[0] = 0;
    z1.m_backend.data._M_elems[1] = 0;
    z1.m_backend.data._M_elems[2] = 0;
    z1.m_backend.data._M_elems[3] = 0;
    z1.m_backend.data._M_elems[4] = 0;
    z1.m_backend.data._M_elems[5] = 0;
    z1.m_backend.data._M_elems[6] = 0;
    z1.m_backend.data._M_elems[7] = 0;
    z1.m_backend.data._M_elems._32_5_ = 0;
    z1.m_backend.data._M_elems[9]._1_3_ = 0;
    z1.m_backend.exp = 0;
    z1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&z1.m_backend,&z2.m_backend,&result_1.m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems._24_5_ = 0;
    result_1.m_backend.data._M_elems[7]._1_3_ = 0;
    result_1.m_backend.data._M_elems._32_5_ = 0;
    result_1.m_backend.data._M_elems[9]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_1.m_backend,
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&scale2.m_backend);
    result_4.m_backend.fpclass = cpp_dec_float_finite;
    result_4.m_backend.prec_elem = 10;
    result_4.m_backend.data._M_elems[0] = 0;
    result_4.m_backend.data._M_elems[1] = 0;
    result_4.m_backend.data._M_elems[2] = 0;
    result_4.m_backend.data._M_elems[3] = 0;
    result_4.m_backend.data._M_elems[4] = 0;
    result_4.m_backend.data._M_elems[5] = 0;
    result_4.m_backend.data._M_elems._24_5_ = 0;
    result_4.m_backend.data._M_elems[7]._1_3_ = 0;
    result_4.m_backend.data._M_elems._32_5_ = 0;
    result_4.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_4.m_backend,&u->m_backend,&scale2.m_backend);
    z2.m_backend.fpclass = cpp_dec_float_finite;
    z2.m_backend.prec_elem = 10;
    z2.m_backend.data._M_elems[0] = 0;
    z2.m_backend.data._M_elems[1] = 0;
    z2.m_backend.data._M_elems[2] = 0;
    z2.m_backend.data._M_elems[3] = 0;
    z2.m_backend.data._M_elems[4] = 0;
    z2.m_backend.data._M_elems[5] = 0;
    z2.m_backend.data._M_elems[6] = 0;
    z2.m_backend.data._M_elems[7] = 0;
    z2.m_backend.data._M_elems._32_5_ = 0;
    z2.m_backend.data._M_elems[9]._1_3_ = 0;
    z2.m_backend.exp = 0;
    z2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&z2.m_backend,&result_1.m_backend,&result_4.m_backend);
    local_b68.m_backend.data._M_elems[0] = z1.m_backend.data._M_elems[0];
    local_b68.m_backend.data._M_elems[1] = z1.m_backend.data._M_elems[1];
    local_b68.m_backend.data._M_elems[2] = z1.m_backend.data._M_elems[2];
    local_b68.m_backend.data._M_elems[3] = z1.m_backend.data._M_elems[3];
    local_b68.m_backend.data._M_elems[4] = z1.m_backend.data._M_elems[4];
    local_b68.m_backend.data._M_elems[5] = z1.m_backend.data._M_elems[5];
    local_b68.m_backend.data._M_elems[6] = z1.m_backend.data._M_elems[6];
    local_b68.m_backend.data._M_elems[7] = z1.m_backend.data._M_elems[7];
    local_b68.m_backend.data._M_elems[9]._1_3_ = z1.m_backend.data._M_elems[9]._1_3_;
    local_b68.m_backend.data._M_elems._32_5_ = z1.m_backend.data._M_elems._32_5_;
    local_b68.m_backend.exp = z1.m_backend.exp;
    local_b68.m_backend.neg = z1.m_backend.neg;
    local_b68.m_backend.fpclass = z1.m_backend.fpclass;
    local_b68.m_backend.prec_elem = z1.m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_3e8,this);
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_b68,&local_3e8);
    if (bVar6) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&z1,0.0);
    }
    local_ba8.m_backend.data._M_elems[9]._1_3_ = z2.m_backend.data._M_elems[9]._1_3_;
    local_ba8.m_backend.data._M_elems._32_5_ = z2.m_backend.data._M_elems._32_5_;
    local_ba8.m_backend.data._M_elems[4] = z2.m_backend.data._M_elems[4];
    local_ba8.m_backend.data._M_elems[5] = z2.m_backend.data._M_elems[5];
    local_ba8.m_backend.data._M_elems[6] = z2.m_backend.data._M_elems[6];
    local_ba8.m_backend.data._M_elems[7] = z2.m_backend.data._M_elems[7];
    local_ba8.m_backend.data._M_elems[0] = z2.m_backend.data._M_elems[0];
    local_ba8.m_backend.data._M_elems[1] = z2.m_backend.data._M_elems[1];
    local_ba8.m_backend.data._M_elems[2] = z2.m_backend.data._M_elems[2];
    local_ba8.m_backend.data._M_elems[3] = z2.m_backend.data._M_elems[3];
    local_ba8.m_backend.exp = z2.m_backend.exp;
    local_ba8.m_backend.neg = z2.m_backend.neg;
    local_ba8.m_backend.fpclass = z2.m_backend.fpclass;
    local_ba8.m_backend.prec_elem = z2.m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_420,this);
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_ba8,&local_420);
    if (bVar6) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&z2,0.0);
    }
    pcVar14 = &(this->m_loJ).m_backend;
    pdVar8 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result_1.m_backend,-*pdVar8,(type *)0x0);
    tVar5 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)pcVar14,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_1.m_backend);
    if (tVar5) {
      pdVar8 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result_4.m_backend,*pdVar8,(type *)0x0);
      tVar5 = boost::multiprecision::operator>=
                        (&this->m_upJ,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_4.m_backend);
      if (tVar5) {
        pdVar8 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_458,-*pdVar8,(type *)0x0);
        tVar5 = boost::multiprecision::operator<=
                          (pnVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_458);
        if (tVar5) {
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_490,*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator>=
                            (u,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_490);
          if (tVar5) {
            iVar3 = this->m_j;
            cStatus->data[iVar3] = ZERO;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)
                       ((x->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar3),0.0);
            goto switchD_002b3476_default;
          }
        }
      }
    }
    u_00 = &this->m_scale;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    tVar5 = boost::multiprecision::operator>(u_00,(double *)&result_1);
    pnVar10 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_k;
    if (tVar5) {
      local_be8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 8);
      local_be8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&(pnVar10->m_backend).data;
      local_be8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 2);
      local_be8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 4);
      local_be8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 6);
      local_be8.m_backend.exp = (pnVar10->m_backend).exp;
      local_be8.m_backend.neg = (pnVar10->m_backend).neg;
      local_be8.m_backend.fpclass = (pnVar10->m_backend).fpclass;
      local_be8.m_backend.prec_elem = (pnVar10->m_backend).prec_elem;
      pnVar1 = &this->m_upJ;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend.data._M_elems[9]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_1.m_backend,&u_00->m_backend,&pnVar1->m_backend);
      result_7.m_backend.fpclass = cpp_dec_float_finite;
      result_7.m_backend.prec_elem = 10;
      result_7.m_backend.data._M_elems[0] = 0;
      result_7.m_backend.data._M_elems[1] = 0;
      result_7.m_backend.data._M_elems[2] = 0;
      result_7.m_backend.data._M_elems[3] = 0;
      result_7.m_backend.data._M_elems[4] = 0;
      result_7.m_backend.data._M_elems[5] = 0;
      result_7.m_backend.data._M_elems._24_5_ = 0;
      result_7.m_backend.data._M_elems[7]._1_3_ = 0;
      result_7.m_backend.data._M_elems._32_5_ = 0;
      result_7.m_backend._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_7.m_backend,&u->m_backend,&result_1.m_backend);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_4c8,this);
      bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_be8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_7.m_backend,&local_4c8);
      if (bVar6) {
LAB_002b4839:
        bVar6 = boost::multiprecision::operator==
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar14,&this->m_upJ);
        VVar7 = (uint)bVar6 * 2;
        pcVar14 = &(this->m_upJ).m_backend;
      }
      else {
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_c68.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 8);
        local_c68.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_c68.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_c68.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_c68.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_c68.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_c68.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_c68.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_c68.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems._24_5_ = 0;
        result_1.m_backend.data._M_elems[7]._1_3_ = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend.data._M_elems[9]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,&pnVar1->m_backend);
        result_9.m_backend.fpclass = cpp_dec_float_finite;
        result_9.m_backend.prec_elem = 10;
        result_9.m_backend.data._M_elems[0] = 0;
        result_9.m_backend.data._M_elems[1] = 0;
        result_9.m_backend.data._M_elems[2] = 0;
        result_9.m_backend.data._M_elems[3] = 0;
        result_9.m_backend.data._M_elems[4] = 0;
        result_9.m_backend.data._M_elems[5] = 0;
        result_9.m_backend.data._M_elems._24_5_ = 0;
        result_9.m_backend.data._M_elems[7]._1_3_ = 0;
        result_9.m_backend.data._M_elems._32_5_ = 0;
        result_9.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_9.m_backend,&pnVar4->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_500,this);
        bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_c68,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_9.m_backend,&local_500);
        if (bVar6) {
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator<
                            (pnVar1,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&result_4.m_backend);
          if (tVar5) goto LAB_002b4839;
        }
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_ce8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 8);
        local_ce8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_ce8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_ce8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_ce8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_ce8.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_ce8.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_ce8.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_ce8.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems._24_5_ = 0;
        result_1.m_backend.data._M_elems[7]._1_3_ = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend.data._M_elems[9]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,pcVar14);
        result_11.m_backend.fpclass = cpp_dec_float_finite;
        result_11.m_backend.prec_elem = 10;
        result_11.m_backend.data._M_elems[0] = 0;
        result_11.m_backend.data._M_elems[1] = 0;
        result_11.m_backend.data._M_elems[2] = 0;
        result_11.m_backend.data._M_elems[3] = 0;
        result_11.m_backend.data._M_elems[4] = 0;
        result_11.m_backend.data._M_elems[5] = 0;
        result_11.m_backend.data._M_elems._24_5_ = 0;
        result_11.m_backend.data._M_elems[7]._1_3_ = 0;
        result_11.m_backend.data._M_elems._32_5_ = 0;
        result_11.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_11.m_backend,&u->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_538,this);
        bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_ce8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_11.m_backend,&local_538);
        if (bVar6) {
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator<
                            (u,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result_4.m_backend);
          if (!tVar5) goto LAB_002b49cb;
LAB_002b494d:
          bVar6 = boost::multiprecision::operator==(pnVar4,u);
          iVar3 = this->m_k;
          cStatus->data[iVar3] = (uint)bVar6 * 2;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&(x->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend,&u->m_backend);
          cStatus->data[this->m_j] = BASIC;
          pcVar14 = &z2.m_backend;
          pcVar11 = &scale2.m_backend;
LAB_002b4c5b:
          result_4.m_backend.fpclass = cpp_dec_float_finite;
          result_4.m_backend.prec_elem = 10;
          result_4.m_backend._37_8_ = 0;
          result_4.m_backend.data._M_elems._32_5_ = 0;
          result_4.m_backend.data._M_elems[7]._1_3_ = 0;
          result_4.m_backend.data._M_elems._24_5_ = 0;
          result_4.m_backend.data._M_elems[4] = 0;
          result_4.m_backend.data._M_elems[5] = 0;
          result_4.m_backend.data._M_elems[2] = 0;
          result_4.m_backend.data._M_elems[3] = 0;
          result_4.m_backend.data._M_elems[0] = 0;
          result_4.m_backend.data._M_elems[1] = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_4.m_backend,pcVar14,pcVar11);
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,&result_4.m_backend,&u_00->m_backend);
          iVar3 = this->m_j;
          pnVar10 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(ulong *)(pnVar10[iVar3].m_backend.data._M_elems + 8) =
               CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                        result_1.m_backend.data._M_elems._32_5_);
          puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar2 = result_1.m_backend.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,
                        result_1.m_backend.data._M_elems._24_5_);
          *(undefined8 *)&pnVar10[iVar3].m_backend.data = result_1.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2) =
               result_1.m_backend.data._M_elems._8_8_;
          pnVar10[iVar3].m_backend.exp = result_1.m_backend.exp;
          pnVar10[iVar3].m_backend.neg = result_1.m_backend.neg;
          pnVar10[iVar3].m_backend.fpclass = result_1.m_backend.fpclass;
          pnVar10[iVar3].m_backend.prec_elem = result_1.m_backend.prec_elem;
          goto switchD_002b3476_default;
        }
LAB_002b49cb:
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_d68.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 8);
        local_d68.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_d68.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_d68.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_d68.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_d68.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_d68.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_d68.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_d68.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems._24_5_ = 0;
        result_1.m_backend.data._M_elems[7]._1_3_ = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend.data._M_elems[9]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,pcVar14);
        result_13.m_backend.fpclass = cpp_dec_float_finite;
        result_13.m_backend.prec_elem = 10;
        result_13.m_backend.data._M_elems[0] = 0;
        result_13.m_backend.data._M_elems[1] = 0;
        result_13.m_backend.data._M_elems[2] = 0;
        result_13.m_backend.data._M_elems[3] = 0;
        result_13.m_backend.data._M_elems[4] = 0;
        result_13.m_backend.data._M_elems[5] = 0;
        result_13.m_backend.data._M_elems._24_5_ = 0;
        result_13.m_backend.data._M_elems[7]._1_3_ = 0;
        result_13.m_backend.data._M_elems._32_5_ = 0;
        result_13.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_13.m_backend,&pnVar4->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_570,this);
        bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_d68,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_13.m_backend,&local_570);
        if (bVar6) {
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,-*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pcVar14,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_4.m_backend);
          if (tVar5) goto LAB_002b4dc3;
        }
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_de8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 8);
        local_de8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_de8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_de8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_de8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_de8.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_de8.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_de8.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_de8.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems._24_5_ = 0;
        result_1.m_backend.data._M_elems[7]._1_3_ = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend.data._M_elems[9]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,pcVar14);
        result_15.m_backend.fpclass = cpp_dec_float_finite;
        result_15.m_backend.prec_elem = 10;
        result_15.m_backend.data._M_elems[0] = 0;
        result_15.m_backend.data._M_elems[1] = 0;
        result_15.m_backend.data._M_elems[2] = 0;
        result_15.m_backend.data._M_elems[3] = 0;
        result_15.m_backend.data._M_elems[4] = 0;
        result_15.m_backend.data._M_elems[5] = 0;
        result_15.m_backend.data._M_elems._24_5_ = 0;
        result_15.m_backend.data._M_elems[7]._1_3_ = 0;
        result_15.m_backend.data._M_elems._32_5_ = 0;
        result_15.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_15.m_backend,&pnVar4->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_5a8,this);
        bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_de8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_15.m_backend,&local_5a8);
        if (bVar6) {
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,-*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator>
                            (pnVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&result_4.m_backend);
          if (tVar5) goto LAB_002b4be2;
        }
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_e68.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 8);
        local_e68.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_e68.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_e68.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_e68.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_e68.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_e68.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_e68.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_e68.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems._24_5_ = 0;
        result_1.m_backend.data._M_elems[7]._1_3_ = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend.data._M_elems[9]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,pcVar14);
        local_ea8.fpclass = cpp_dec_float_finite;
        local_ea8.prec_elem = 10;
        local_ea8.data._M_elems[0] = 0;
        local_ea8.data._M_elems[1] = 0;
        local_ea8.data._M_elems[2] = 0;
        local_ea8.data._M_elems[3] = 0;
        local_ea8.data._M_elems[4] = 0;
        local_ea8.data._M_elems[5] = 0;
        local_ea8.data._M_elems._24_5_ = 0;
        local_ea8.data._M_elems[7]._1_3_ = 0;
        local_ea8.data._M_elems._32_5_ = 0;
        local_ea8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_ea8,&pnVar4->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_5e0,this);
        bVar6 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_e68,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_ea8,&local_5e0);
        if (!bVar6) {
          pSVar9 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&result_1,"XMAISM08 This should never happen.",(allocator *)&result_4
                    );
          SPxInternalCodeException::SPxInternalCodeException(pSVar9,(string *)&result_1);
          __cxa_throw(pSVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
LAB_002b4dc3:
        bVar6 = boost::multiprecision::operator==
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar14,&this->m_upJ);
        VVar7 = bVar6 + ON_LOWER;
      }
      iVar3 = this->m_j;
      cStatus->data[iVar3] = VVar7;
      pcVar11 = &(x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend;
    }
    else {
      local_ee8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 8);
      local_ee8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&(pnVar10->m_backend).data;
      local_ee8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 2);
      local_ee8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 4);
      local_ee8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 6);
      local_ee8.m_backend.exp = (pnVar10->m_backend).exp;
      local_ee8.m_backend.neg = (pnVar10->m_backend).neg;
      local_ee8.m_backend.fpclass = (pnVar10->m_backend).fpclass;
      local_ee8.m_backend.prec_elem = (pnVar10->m_backend).prec_elem;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend.data._M_elems[9]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_1.m_backend,&u_00->m_backend,pcVar14);
      result_17.m_backend.fpclass = cpp_dec_float_finite;
      result_17.m_backend.prec_elem = 10;
      result_17.m_backend.data._M_elems[0] = 0;
      result_17.m_backend.data._M_elems[1] = 0;
      result_17.m_backend.data._M_elems[2] = 0;
      result_17.m_backend.data._M_elems[3] = 0;
      result_17.m_backend.data._M_elems[4] = 0;
      result_17.m_backend.data._M_elems[5] = 0;
      result_17.m_backend.data._M_elems._24_5_ = 0;
      result_17.m_backend.data._M_elems[7]._1_3_ = 0;
      result_17.m_backend.data._M_elems._32_5_ = 0;
      result_17.m_backend._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_17.m_backend,&u->m_backend,&result_1.m_backend);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_618,this);
      bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_ee8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_17.m_backend,&local_618);
      if (bVar6) goto LAB_002b4dc3;
      iVar3 = this->m_k;
      pnVar10 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_f68.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 8);
      local_f68.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
      local_f68.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
      puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
      local_f68.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_f68.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_f68.m_backend.exp = pnVar10[iVar3].m_backend.exp;
      local_f68.m_backend.neg = pnVar10[iVar3].m_backend.neg;
      local_f68.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
      local_f68.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend.data._M_elems[9]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_1.m_backend,&u_00->m_backend,pcVar14);
      result_19.m_backend.fpclass = cpp_dec_float_finite;
      result_19.m_backend.prec_elem = 10;
      result_19.m_backend.data._M_elems[0] = 0;
      result_19.m_backend.data._M_elems[1] = 0;
      result_19.m_backend.data._M_elems[2] = 0;
      result_19.m_backend.data._M_elems[3] = 0;
      result_19.m_backend.data._M_elems[4] = 0;
      result_19.m_backend.data._M_elems[5] = 0;
      result_19.m_backend.data._M_elems._24_5_ = 0;
      result_19.m_backend.data._M_elems[7]._1_3_ = 0;
      result_19.m_backend.data._M_elems._32_5_ = 0;
      result_19.m_backend._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_19.m_backend,&pnVar4->m_backend,&result_1.m_backend);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_650,this);
      bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_f68,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_19.m_backend,&local_650);
      if (!bVar6) {
LAB_002b4455:
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_fe8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 8);
        local_fe8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_fe8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_fe8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_fe8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_fe8.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_fe8.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_fe8.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_fe8.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        pnVar1 = &this->m_upJ;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems._24_5_ = 0;
        result_1.m_backend.data._M_elems[7]._1_3_ = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend.data._M_elems[9]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,&pnVar1->m_backend);
        result_21.m_backend.fpclass = cpp_dec_float_finite;
        result_21.m_backend.prec_elem = 10;
        result_21.m_backend.data._M_elems[0] = 0;
        result_21.m_backend.data._M_elems[1] = 0;
        result_21.m_backend.data._M_elems[2] = 0;
        result_21.m_backend.data._M_elems[3] = 0;
        result_21.m_backend.data._M_elems[4] = 0;
        result_21.m_backend.data._M_elems[5] = 0;
        result_21.m_backend.data._M_elems._24_5_ = 0;
        result_21.m_backend.data._M_elems[7]._1_3_ = 0;
        result_21.m_backend.data._M_elems._32_5_ = 0;
        result_21.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_21.m_backend,&u->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_688,this);
        bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_fe8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_21.m_backend,&local_688);
        if (bVar6) {
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator<
                            (u,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result_4.m_backend);
          if (tVar5) goto LAB_002b494d;
        }
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1068.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 8);
        local_1068.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_1068.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_1068.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_1068.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_1068.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_1068.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_1068.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_1068.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems._24_5_ = 0;
        result_1.m_backend.data._M_elems[7]._1_3_ = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend.data._M_elems[9]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,&pnVar1->m_backend);
        result_23.m_backend.fpclass = cpp_dec_float_finite;
        result_23.m_backend.prec_elem = 10;
        result_23.m_backend.data._M_elems[0] = 0;
        result_23.m_backend.data._M_elems[1] = 0;
        result_23.m_backend.data._M_elems[2] = 0;
        result_23.m_backend.data._M_elems[3] = 0;
        result_23.m_backend.data._M_elems[4] = 0;
        result_23.m_backend.data._M_elems[5] = 0;
        result_23.m_backend.data._M_elems._24_5_ = 0;
        result_23.m_backend.data._M_elems[7]._1_3_ = 0;
        result_23.m_backend.data._M_elems._32_5_ = 0;
        result_23.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_23.m_backend,&pnVar4->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_6c0,this);
        bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_1068,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_23.m_backend,&local_6c0);
        if (bVar6) {
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator<
                            (pnVar1,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&result_4.m_backend);
          if (tVar5) goto LAB_002b4839;
        }
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_10e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 8);
        local_10e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_10e8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_10e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_10e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_10e8.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_10e8.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_10e8.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_10e8.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems._24_5_ = 0;
        result_1.m_backend.data._M_elems[7]._1_3_ = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend.data._M_elems[9]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,&pnVar1->m_backend);
        result_25.m_backend.fpclass = cpp_dec_float_finite;
        result_25.m_backend.prec_elem = 10;
        result_25.m_backend.data._M_elems[0] = 0;
        result_25.m_backend.data._M_elems[1] = 0;
        result_25.m_backend.data._M_elems[2] = 0;
        result_25.m_backend.data._M_elems[3] = 0;
        result_25.m_backend.data._M_elems[4] = 0;
        result_25.m_backend.data._M_elems[5] = 0;
        result_25.m_backend.data._M_elems._24_5_ = 0;
        result_25.m_backend.data._M_elems[7]._1_3_ = 0;
        result_25.m_backend.data._M_elems._32_5_ = 0;
        result_25.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_25.m_backend,&pnVar4->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_6f8,this);
        bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_10e8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_25.m_backend,&local_6f8);
        if (!bVar6) {
LAB_002b475a:
          iVar3 = this->m_k;
          pnVar10 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_1168.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 8);
          local_1168.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
          local_1168.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
          puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
          local_1168.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_1168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_1168.m_backend.exp = pnVar10[iVar3].m_backend.exp;
          local_1168.m_backend.neg = pnVar10[iVar3].m_backend.neg;
          local_1168.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
          local_1168.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,&u_00->m_backend,&pnVar1->m_backend);
          local_11a8.fpclass = cpp_dec_float_finite;
          local_11a8.prec_elem = 10;
          local_11a8.data._M_elems[0] = 0;
          local_11a8.data._M_elems[1] = 0;
          local_11a8.data._M_elems[2] = 0;
          local_11a8.data._M_elems[3] = 0;
          local_11a8.data._M_elems[4] = 0;
          local_11a8.data._M_elems[5] = 0;
          local_11a8.data._M_elems._24_5_ = 0;
          local_11a8.data._M_elems[7]._1_3_ = 0;
          local_11a8.data._M_elems._32_5_ = 0;
          local_11a8._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_11a8,&pnVar4->m_backend,&result_1.m_backend);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_730,this);
          bVar6 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_1168,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_11a8,&local_730);
          if (!bVar6) {
            pSVar9 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&result_1,"XMAISM09 This should never happen.",
                       (allocator *)&result_4);
            SPxInternalCodeException::SPxInternalCodeException(pSVar9,(string *)&result_1);
            __cxa_throw(pSVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          goto LAB_002b4839;
        }
        pdVar8 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&result_4.m_backend,-*pdVar8,(type *)0x0);
        tVar5 = boost::multiprecision::operator>
                          (pnVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&result_4.m_backend);
        if (!tVar5) goto LAB_002b475a;
LAB_002b4be2:
        bVar6 = boost::multiprecision::operator==(pnVar4,u);
        iVar3 = this->m_k;
        cStatus->data[iVar3] = bVar6 + ON_LOWER;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&(x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend,&pnVar4->m_backend);
        cStatus->data[this->m_j] = BASIC;
        pcVar14 = &z1.m_backend;
        pcVar11 = &scale1.m_backend;
        goto LAB_002b4c5b;
      }
      pdVar8 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result_4.m_backend,-*pdVar8,(type *)0x0);
      tVar5 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar14,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_4.m_backend);
      if (!tVar5) goto LAB_002b4455;
      bVar6 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar14,&this->m_upJ);
      iVar3 = this->m_j;
      cStatus->data[iVar3] = bVar6 + ON_LOWER;
      pcVar11 = &(x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(pcVar11,pcVar14);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems._24_5_ = 0;
    result_1.m_backend.data._M_elems[7]._1_3_ = 0;
    result_1.m_backend.data._M_elems._32_5_ = 0;
    result_1.m_backend.data._M_elems[9]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_1.m_backend,&u_00->m_backend,
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              (&(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&result_1.m_backend);
  default:
    goto switchD_002b3476_default;
  }
  cStatus->data[this->m_j] = VVar7;
switchD_002b3476_default:
  scale1.m_backend.fpclass = cpp_dec_float_finite;
  scale1.m_backend.prec_elem = 10;
  scale1.m_backend.data._M_elems[0] = 0;
  scale1.m_backend.data._M_elems[1] = 0;
  scale1.m_backend.data._M_elems[2] = 0;
  scale1.m_backend.data._M_elems[3] = 0;
  scale1.m_backend.data._M_elems[4] = 0;
  scale1.m_backend.data._M_elems[5] = 0;
  scale1.m_backend.data._M_elems._24_5_ = 0;
  scale1.m_backend.data._M_elems[7]._1_3_ = 0;
  scale1.m_backend.data._M_elems._32_5_ = 0;
  scale1.m_backend.data._M_elems[9]._1_3_ = 0;
  scale1.m_backend.exp = 0;
  scale1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&scale1.m_backend,&(this->m_scale).m_backend,
             &(r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend);
  iVar3 = this->m_j;
  pnVar10 = (r->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar10[iVar3].m_backend.data._M_elems + 8) =
       CONCAT35(scale1.m_backend.data._M_elems[9]._1_3_,scale1.m_backend.data._M_elems._32_5_);
  puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = scale1.m_backend.data._M_elems._16_8_;
  *(ulong *)(puVar2 + 2) =
       CONCAT35(scale1.m_backend.data._M_elems[7]._1_3_,scale1.m_backend.data._M_elems._24_5_);
  *(undefined8 *)&pnVar10[iVar3].m_backend.data = scale1.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2) = scale1.m_backend.data._M_elems._8_8_
  ;
  pnVar10[iVar3].m_backend.exp = scale1.m_backend.exp;
  pnVar10[iVar3].m_backend.neg = scale1.m_backend.neg;
  pnVar10[iVar3].m_backend.fpclass = scale1.m_backend.fpclass;
  pnVar10[iVar3].m_backend.prec_elem = scale1.m_backend.prec_elem;
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateColsPS::execute(VectorBase<R>& x,
      VectorBase<R>&,
      VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   if(m_isFirst)
   {
#ifdef SOPLEX_CHECK_BASIS_DIM

      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM25 Dimension doesn't match after this step.");
      }

#endif
      return;
   }


   // correcting the change of idx by deletion of the columns:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int cIdx_new = m_perm[i];
            int cIdx = i;
            x[cIdx] = x[cIdx_new];
            r[cIdx] = r[cIdx_new];
            cStatus[cIdx] = cStatus[cIdx_new];
         }
      }

      return;
   }

   // primal & basis:
   SOPLEX_ASSERT_WARN("WMAISM03", isNotZero(m_scale, this->epsilon()));

   if(cStatus[m_k] == SPxSolverBase<R>::ON_LOWER)
   {
      x[m_k] = m_loK;

      if(m_scale > 0)
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ON_UPPER)
   {
      x[m_k] = m_upK;

      if(m_scale > 0)
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::FIXED)
   {
      // => x[m_k] and x[m_j] are also fixed before the corresponding preprocessing step
      x[m_j]       = m_loJ;
      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ZERO)
   {
      /* we only aggregate duplicate columns if 0 is contained in their bounds, so we can handle this case properly */
      assert(isZero(x[m_k], this->epsilon()));
      assert(LErel(m_loJ, R(0.0), this->epsilon()));
      assert(GErel(m_upJ, R(0.0), this->epsilon()));
      assert(LErel(m_loK, R(0.0), this->epsilon()));
      assert(GErel(m_upK, R(0.0), this->epsilon()));

      if(isZero(m_loK, this->epsilon()) && isZero(m_upK, this->epsilon()) && m_loK == m_upK)
         cStatus[m_k] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loK, R(0.0), this->epsilon()) && GErel(m_upK, R(0.0), this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM05 This should never happen.");

      x[m_j] = 0.0;

      if(isZero(m_loJ, this->epsilon()) && isZero(m_upJ, this->epsilon()) && m_loJ == m_upJ)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loJ, R(0.0), this->epsilon()) && GErel(m_upJ, R(0.0), this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM06 This should never happen.");
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::BASIC)
   {
      R scale1 = maxAbs(x[m_k], m_loK);
      R scale2 = maxAbs(x[m_k], m_upK);

      if(scale1 < 1.0)
         scale1 = 1.0;

      if(scale2 < 1.0)
         scale2 = 1.0;

      R z1 = (x[m_k] / scale1) - (m_loK / scale1);
      R z2 = (x[m_k] / scale2) - (m_upK / scale2);

      if(isZero(z1, this->epsilon()))
         z1 = 0.0;

      if(isZero(z2, this->epsilon()))
         z2 = 0.0;

      if(m_loJ <= R(-infinity) && m_upJ >= R(infinity) && m_loK <= R(-infinity) && m_upK >= R(infinity))
      {
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
         x[m_j] = 0.0;
      }
      else if(m_scale > 0.0)
      {
         if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM08 This should never happen.");
         }
      }
      else
      {
         assert(m_scale < 0.0);

         if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM09 This should never happen.");
         }
      }
   }

   // dual:
   r[m_j] = m_scale * r[m_k];
}